

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::r_formatter<spdlog::details::null_scoped_padder>::format
          (r_formatter<spdlog::details::null_scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  buffer<char> *buf;
  uint uVar4;
  ulong uVar5;
  char *begin;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  uint local_38 [6];
  
  uVar1 = tm_time->tm_hour;
  uVar4 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar4 = uVar1;
  }
  if (uVar4 < 100) {
    uVar5 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)((ulong)uVar4 / 10) | 0x30;
    uVar5 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar4 + (char)(uVar4 / 10) * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_38;
    args.desc_ = 1;
    local_38[0] = uVar4;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  uVar5 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ':';
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    uVar5 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)(uVar1 / 10) | 0x30;
    uVar5 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_38;
    args_00.desc_ = 1;
    local_38[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args_00,(locale_ref)0x0);
  }
  uVar5 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ':';
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    uVar5 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (byte)(uVar1 / 10) | 0x30;
    uVar5 = (dest->super_buffer<char>).size_ + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar5) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
    }
    sVar2 = (dest->super_buffer<char>).size_;
    (dest->super_buffer<char>).size_ = sVar2 + 1;
    (dest->super_buffer<char>).ptr_[sVar2] = (char)uVar1 + (char)(uVar1 / 10) * -10 | 0x30;
  }
  else {
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_38;
    args_01.desc_ = 1;
    local_38[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_01,args_01,(locale_ref)0x0);
  }
  uVar5 = (dest->super_buffer<char>).size_ + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar5) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar5);
  }
  sVar2 = (dest->super_buffer<char>).size_;
  (dest->super_buffer<char>).size_ = sVar2 + 1;
  (dest->super_buffer<char>).ptr_[sVar2] = ' ';
  begin = "AM";
  if (0xb < tm_time->tm_hour) {
    begin = "PM";
  }
  pcVar3 = "AM";
  if (0xb < tm_time->tm_hour) {
    pcVar3 = "PM";
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,begin,pcVar3 + 2);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }